

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-mltpctive-dynamical-system.cpp
# Opt level: O2

Matrix * __thiscall
stateObservation::IMUMltpctiveDynamicalSystem::getAMatrix
          (Matrix *__return_storage_ptr__,IMUMltpctiveDynamicalSystem *this,Vector *xh)

{
  Matrix3 *this_00;
  double *scalar;
  Vector3 *dst;
  Matrix *other;
  int local_2f4;
  undefined1 local_2f0 [16];
  scalar_constant_op<double> local_2e0;
  scalar_constant_op<double> sStack_2d8;
  variable_if_dynamic<long,__1> local_2d0;
  variable_if_dynamic<long,__1> vStack_2c8;
  scalar_constant_op<double> local_2c0;
  Index IStack_2b8;
  scalar_constant_op<double> local_2a8;
  scalar_constant_op<double> local_290;
  scalar_constant_op<double> local_278;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_268;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_220;
  undefined1 local_1b8 [24];
  variable_if_dynamic<long,__1> vStack_1a0;
  scalar_constant_op<double> sStack_198;
  Index local_190;
  Index IStack_188;
  scalar_constant_op<double> local_178;
  XprTypeNested local_158;
  XprTypeNested pMStack_150;
  XprTypeNested local_148;
  variable_if_dynamic<long,__1> vStack_140;
  double local_138;
  Index IStack_130;
  scalar_constant_op<double> local_120;
  scalar_constant_op<double> local_108;
  scalar_constant_op<double> local_f0;
  undefined1 local_d8 [16];
  scalar_constant_op<double> local_c8;
  variable_if_dynamic<long,__1> vStack_c0;
  Index local_b8;
  Index IStack_b0;
  scalar_constant_op<double> local_a0;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>> local_90 [48];
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>> local_60 [48];
  
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)local_60,xh,10,3);
  scalar = &this->dt_;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>const,3,1,false>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_d8,local_60,scalar);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)local_90,xh,0x10,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>const,3,1,false>>::operator*
            (&local_268,local_90,scalar);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>const,3,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator*(&local_220,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
               *)&local_268,scalar);
  local_2f4 = 2;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>const,3,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)local_2f0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
               *)&local_220,&local_2f4);
  local_190 = local_b8;
  IStack_188 = IStack_b0;
  vStack_1a0.m_value = (long)local_c8.m_other;
  sStack_198.m_other = (double)vStack_c0.m_value;
  local_1b8._8_8_ = local_d8._0_8_;
  local_1b8._16_8_ = local_d8._8_8_;
  local_178.m_other = local_a0.m_other;
  local_158 = (XprTypeNested)local_2e0.m_other;
  pMStack_150 = (XprTypeNested)sStack_2d8.m_other;
  local_148 = (XprTypeNested)local_2d0.m_value;
  vStack_140.m_value = vStack_2c8.m_value;
  local_138 = local_2c0.m_other;
  IStack_130 = IStack_2b8;
  local_120.m_other = local_2a8.m_other;
  local_108.m_other = local_290.m_other;
  local_f0.m_other = local_278.m_other;
  dst = &(this->opt_).deltaR;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>>
            (dst,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                  *)local_1b8);
  this_00 = &(this->opt_).jRv;
  kine::derivateRotationMultiplicative(dst,&(this->opt_).jRR,this_00);
  other = &(this->opt_).AJacobian;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_3,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_3,_false> *)local_1b8,other,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,3,3,false>,Eigen::Matrix<double,3,3,0,3,3>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_3,_false> *)local_1b8,
             &(this->opt_).jRR);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_3,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_3,_false> *)local_2f0,other,0,6);
  sStack_198.m_other = (double)local_2d0.m_value;
  local_190 = vStack_2c8.m_value;
  local_1b8._16_8_ = local_2e0.m_other;
  vStack_1a0.m_value = (long)sStack_2d8.m_other;
  local_1b8._0_8_ = local_2f0._0_8_;
  local_1b8._8_8_ = local_2f0._8_8_;
  Eigen::
  DenseBase<Eigen::Diagonal<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_3,_false>,_0>_>
  ::setConstant((DenseBase<Eigen::Diagonal<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_3,_false>,_0>_>
                 *)local_1b8,scalar);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)local_2f0,(MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)this_00,scalar);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_3,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_3,_false> *)local_1b8,other,3,9);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,3,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_3,_false> *)local_1b8,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)local_2f0);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_6,_6,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_6,_6,_false> *)local_2f0,other,6,0xc);
  sStack_198.m_other = (double)local_2d0.m_value;
  local_190 = vStack_2c8.m_value;
  local_1b8._16_8_ = local_2e0.m_other;
  vStack_1a0.m_value = (long)sStack_2d8.m_other;
  local_1b8._0_8_ = local_2f0._0_8_;
  local_1b8._8_8_ = local_2f0._8_8_;
  Eigen::
  DenseBase<Eigen::Diagonal<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_6,_6,_false>,_0>_>
  ::setConstant((DenseBase<Eigen::Diagonal<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_6,_6,_false>,_0>_>
                 *)local_1b8,scalar);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_3,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_3,_false> *)local_2f0,other,0,0xc);
  sStack_198.m_other = (double)local_2d0.m_value;
  local_190 = vStack_2c8.m_value;
  local_1b8._16_8_ = local_2e0.m_other;
  vStack_1a0.m_value = (long)sStack_2d8.m_other;
  local_1b8._0_8_ = local_2f0._0_8_;
  local_1b8._8_8_ = local_2f0._8_8_;
  local_220._0_8_ = this->dt_ * this->dt_ * 0.5;
  Eigen::
  DenseBase<Eigen::Diagonal<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_3,_false>,_0>_>
  ::setConstant((DenseBase<Eigen::Diagonal<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_3,_false>,_0>_>
                 *)local_1b8,(Scalar *)&local_220);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)local_d8,(MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)this_00,scalar);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)local_2f0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
               *)local_d8,scalar);
  local_268.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.m_data.
  _0_4_ = 2;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
  ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)local_1b8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
               *)local_2f0,(int *)&local_268);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_3,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_3,_false> *)&local_220,other,3,0xf)
  ;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,3,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_3,_false> *)&local_220,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)local_1b8);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)__return_storage_ptr__,
             (DenseStorage<double,__1,__1,__1,_0> *)other);
  return __return_storage_ptr__;
}

Assistant:

Matrix IMUMltpctiveDynamicalSystem::getAMatrix(const Vector & xh)
{

  opt_.deltaR = xh.segment<3>(indexes::angVel) * dt_ + xh.segment<3>(indexes::angAcc) * dt_ * dt_ / 2;

  kine::derivateRotationMultiplicative(opt_.deltaR, opt_.jRR, opt_.jRv);

  opt_.AJacobian.block<3, 3>(indexesTangent::ori, indexesTangent::ori) = opt_.jRR;

  opt_.AJacobian.block<3, 3>(indexesTangent::pos, indexesTangent::linVel).diagonal().setConstant(dt_);
  opt_.AJacobian.block<3, 3>(indexesTangent::ori, indexesTangent::angVel) = opt_.jRv * dt_;
  opt_.AJacobian.block<6, 6>(indexesTangent::linVel, indexesTangent::linAcc).diagonal().setConstant(dt_);

  opt_.AJacobian.block<3, 3>(indexesTangent::pos, indexesTangent::linAcc).diagonal().setConstant(dt_ * dt_ * 0.5);
  opt_.AJacobian.block<3, 3>(indexesTangent::ori, indexesTangent::angAcc) = opt_.jRv * dt_ * dt_ / 2;

  return opt_.AJacobian;
}